

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>
pbrt::PathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool regularize;
  PathIntegrator *this;
  string local_b8;
  int local_94;
  string lightStrategy;
  string local_70;
  PrimitiveHandle *local_50;
  SamplerHandle *local_48;
  PrimitiveHandle local_40;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_38;
  
  lightStrategy._M_dataplus._M_p = (pointer)&lightStrategy.field_2;
  local_48 = sampler;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"maxdepth","");
  local_50 = aggregate;
  local_94 = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&lightStrategy,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != &lightStrategy.field_2) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"lightsampler","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"bvh","");
  ParameterDictionary::GetOneString
            (&lightStrategy,(ParameterDictionary *)camera,&local_b8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"regularize","");
  regularize = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this = (PathIntegrator *)operator_new(0x68);
  local_70._M_dataplus._M_p =
       (pointer)(local_48->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
  local_38.bits =
       (local_50->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  local_40.
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           )(lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_b8,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)loc);
  PathIntegrator(this,local_94,(CameraHandle *)&local_70,(SamplerHandle *)&local_38,&local_40,
                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_b8,
                 &lightStrategy,regularize);
  (parameters->params).alloc.memoryResource = (memory_resource *)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_b8._M_dataplus._M_p,
                    local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != &lightStrategy.field_2) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
            )parameters;
}

Assistant:

std::unique_ptr<PathIntegrator> PathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    std::string lightStrategy = parameters.GetOneString("lightsampler", "bvh");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<PathIntegrator>(maxDepth, camera, sampler, aggregate, lights,
                                            lightStrategy, regularize);
}